

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

void __thiscall soinn::ESOINN::mergeClasses(ESOINN *this,int A,int B)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  reference ppvVar4;
  vertex_bundled *pvVar5;
  tuples local_50 [16];
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> local_40;
  _List_iterator<void_*> local_30;
  VertexIterator end;
  VertexIterator current;
  int local_18;
  int classId;
  int B_local;
  int A_local;
  ESOINN *this_local;
  
  local_18 = B;
  classId = A;
  _B_local = this;
  piVar3 = std::min<int>(&classId,&local_18);
  iVar1 = *piVar3;
  std::_List_iterator<void_*>::_List_iterator(&end);
  std::_List_iterator<void_*>::_List_iterator(&local_30);
  local_40 = boost::
             vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                       ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                         *)&this->graph);
  boost::tuples::tie<std::_List_iterator<void*>,std::_List_iterator<void*>>(local_50,&end,&local_30)
  ;
  boost::tuples::
  tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_50,&local_40);
  do {
    bVar2 = std::operator!=(&end,&local_30);
    if (!bVar2) {
      return;
    }
    ppvVar4 = std::_List_iterator<void_*>::operator*(&end);
    pvVar5 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,*ppvVar4);
    if (pvVar5->classId == classId) {
LAB_0017356c:
      ppvVar4 = std::_List_iterator<void_*>::operator*(&end);
      pvVar5 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*ppvVar4);
      pvVar5->classId = iVar1;
    }
    else {
      ppvVar4 = std::_List_iterator<void_*>::operator*(&end);
      pvVar5 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*ppvVar4);
      if (pvVar5->classId == local_18) goto LAB_0017356c;
    }
    std::_List_iterator<void_*>::operator++(&end,0);
  } while( true );
}

Assistant:

void ESOINN::mergeClasses(int A, int B)
{
    int classId = std::min(A, B);
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        if(graph[*current].classId == A || graph[*current].classId == B)
        {
            graph[*current].classId = classId;
        }
    }
}